

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

string * __thiscall
helics::CommonCore::getSourceTargets_abi_cxx11_(CommonCore *this,InterfaceHandle handle)

{
  _Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  *p_Var1;
  InputInfo *pIVar2;
  FederateState *pFVar3;
  EndpointInfo *pEVar4;
  string *psVar5;
  undefined4 in_ESI;
  undefined8 in_RDI;
  EndpointInfo *eptInfo;
  FederateState *fed_1;
  InputInfo *inpInfo;
  FederateState *fed;
  _Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  *handleInfo;
  CommonCore *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined8 in_stack_ffffffffffffffc0;
  InterfaceHandle handle_00;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined8 in_stack_ffffffffffffffd0;
  LocalFederateId federateID;
  undefined4 in_stack_fffffffffffffff0;
  undefined1 *local_8;
  
  handle_00.hid = (BaseType)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  federateID.fid = (BaseType)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  p_Var1 = getHandleInfo(in_stack_ffffffffffffff88,
                         (InterfaceHandle)(BaseType)((ulong)in_RDI >> 0x20));
  if (p_Var1 != (_Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                 *)0x0) {
    switch((p_Var1->
           super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
           ._M_storage._M_storage.__data[4]) {
    case 'e':
    case 's':
      pFVar3 = getFederateAt((CommonCore *)
                             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                             federateID);
      FederateState::interfaces(pFVar3);
      pEVar4 = InterfaceInfo::getEndpoint
                         ((InterfaceInfo *)
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),handle_00);
      if (pEVar4 != (EndpointInfo *)0x0) {
        psVar5 = EndpointInfo::getSourceTargets_abi_cxx11_
                           ((EndpointInfo *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
        return psVar5;
      }
      break;
    case 'f':
      break;
    default:
      local_8 = gEmptyString_abi_cxx11_;
      return (string *)local_8;
    case 'i':
      pFVar3 = getFederateAt((CommonCore *)
                             CONCAT44(*(undefined4 *)
                                       &(p_Var1->
                                        super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                                        ).
                                        super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                                        ._M_storage._M_storage,in_stack_ffffffffffffffc8),federateID
                            );
      FederateState::interfaces(pFVar3);
      pIVar2 = InterfaceInfo::getInput
                         ((InterfaceInfo *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8),handle_00);
      if (pIVar2 != (InputInfo *)0x0) {
        psVar5 = InputInfo::getTargets_abi_cxx11_
                           ((InputInfo *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
        return psVar5;
      }
      break;
    case 'p':
      local_8 = gEmptyString_abi_cxx11_;
      return (string *)local_8;
    }
  }
  local_8 = gEmptyString_abi_cxx11_;
  return (string *)local_8;
}

Assistant:

const std::string& CommonCore::getSourceTargets(InterfaceHandle handle) const
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo != nullptr) {
        switch (handleInfo->handleType) {
            case InterfaceType::INPUT: {
                auto* fed = getFederateAt(handleInfo->local_fed_id);
                auto* inpInfo = fed->interfaces().getInput(handle);
                if (inpInfo != nullptr) {
                    return inpInfo->getTargets();
                }
                break;
            }
            case InterfaceType::PUBLICATION:
                return gEmptyString;
            case InterfaceType::ENDPOINT:
            case InterfaceType::SINK: {
                auto* fed = getFederateAt(handleInfo->local_fed_id);
                auto* eptInfo = fed->interfaces().getEndpoint(handle);
                if (eptInfo != nullptr) {
                    return eptInfo->getSourceTargets();
                }
                break;
            }
            case InterfaceType::FILTER: {
                break;
            }
            default:
                return gEmptyString;
        }
    }
    return gEmptyString;
}